

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::TraverseSchema::processAttributes
          (TraverseSchema *this,DOMElement *elem,DOMElement *attElem,ComplexTypeInfo *typeInfo,
          bool isBaseAnyType)

{
  XMLCh XVar1;
  XMLCh XVar2;
  DefAttTypes DVar3;
  ComplexTypeInfo *baseTypeInfo;
  BaseRefVectorOf<xercesc_4_0::SchemaAttDef> *this_00;
  QName *pQVar4;
  XMLSize_t XVar5;
  SchemaAttDef *pSVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  XMLCh *pXVar9;
  XercesAttGroupInfo *pXVar10;
  SchemaAttDef *pSVar11;
  XercesAttGroupInfo **ppXVar12;
  SchemaAttDef *pSVar13;
  SchemaAttDef *pSVar14;
  XMLAttDefList *pXVar15;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 *puVar16;
  XMLCh *pXVar17;
  XMLCh *pXVar18;
  ulong uVar19;
  XMLSize_t getAt;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  ValueVectorOf<xercesc_4_0::XercesAttGroupInfo_*> attGroupList;
  SchemaAttDef *local_90;
  SchemaAttDef *local_88;
  SchemaAttDef *local_78;
  DefAttTypes local_6c;
  ValueVectorOf<xercesc_4_0::XercesAttGroupInfo_*> local_58;
  undefined4 extraout_var_00;
  
  if (typeInfo != (ComplexTypeInfo *)0x0) {
    baseTypeInfo = typeInfo->fBaseComplexTypeInfo;
    if ((baseTypeInfo != (ComplexTypeInfo *)0x0) && (baseTypeInfo->fPreprocessed == true)) {
      puVar16 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar16 = 2;
      __cxa_throw(puVar16,&ExceptionCodes::typeinfo,0);
    }
    local_58.fMemoryManager = this->fGrammarPoolMemoryManager;
    local_58.fCallDestructor = false;
    local_58.fCurCount = 0;
    local_58.fMaxCount = 4;
    local_58.fElemList = (XercesAttGroupInfo **)0x0;
    iVar7 = (*(local_58.fMemoryManager)->_vptr_MemoryManager[3])();
    local_58.fElemList = (XercesAttGroupInfo **)CONCAT44(extraout_var,iVar7);
    local_90 = (SchemaAttDef *)0x0;
    memset(local_58.fElemList,0,local_58.fMaxCount << 3);
    pSVar11 = (SchemaAttDef *)0x0;
    for (; XVar5 = local_58.fCurCount, &attElem->super_DOMNode != (DOMNode *)0x0;
        attElem = XUtil::getNextSiblingElement(&attElem->super_DOMNode)) {
      iVar7 = (*(attElem->super_DOMNode)._vptr_DOMNode[0x18])(attElem);
      pXVar9 = (XMLCh *)CONCAT44(extraout_var_00,iVar7);
      pSVar14 = local_90;
      if (pXVar9 == L"attribute") {
LAB_0033a9c0:
        if (pSVar11 != (SchemaAttDef *)0x0) {
          reportSchemaError(this,attElem,L"http://apache.org/xml/messages/XMLErrors",0x99);
        }
        traverseAttributeDecl(this,attElem,typeInfo,false);
      }
      else {
        pXVar17 = L"attribute";
        if (pXVar9 == (XMLCh *)0x0) {
LAB_0033a989:
          if (*pXVar17 == L'\0') goto LAB_0033a9c0;
        }
        else {
          pXVar17 = L"attribute";
          pXVar18 = pXVar9;
          do {
            XVar1 = *pXVar18;
            if (XVar1 == L'\0') goto LAB_0033a989;
            pXVar18 = pXVar18 + 1;
            XVar2 = *pXVar17;
            pXVar17 = pXVar17 + 1;
          } while (XVar1 == XVar2);
        }
        if (pXVar9 == L"attributeGroup") {
LAB_0033aa50:
          if (pSVar11 != (SchemaAttDef *)0x0) {
            reportSchemaError(this,attElem,L"http://apache.org/xml/messages/XMLErrors",0x99);
          }
          pXVar10 = traverseAttributeGroupDecl(this,attElem,typeInfo,false);
          if (pXVar10 != (XercesAttGroupInfo *)0x0) {
            bVar21 = local_58.fCurCount != 0;
            if (bVar21) {
              if (*local_58.fElemList == pXVar10) goto LAB_0033a9f2;
              uVar20 = 1;
              do {
                uVar19 = uVar20;
                if (local_58.fCurCount == uVar19) break;
                uVar20 = uVar19 + 1;
              } while (local_58.fElemList[uVar19] != pXVar10);
              bVar21 = uVar19 < local_58.fCurCount;
            }
            if (!bVar21) {
              ValueVectorOf<xercesc_4_0::XercesAttGroupInfo_*>::ensureExtraCapacity(&local_58,1);
              local_58.fElemList[local_58.fCurCount] = pXVar10;
              local_58.fCurCount = local_58.fCurCount + 1;
            }
          }
        }
        else {
          pXVar17 = L"attributeGroup";
          if (pXVar9 == (XMLCh *)0x0) {
LAB_0033aa02:
            if (*pXVar17 == L'\0') goto LAB_0033aa50;
          }
          else {
            pXVar17 = L"attributeGroup";
            pXVar18 = pXVar9;
            do {
              XVar1 = *pXVar18;
              if (XVar1 == L'\0') goto LAB_0033aa02;
              pXVar18 = pXVar18 + 1;
              XVar2 = *pXVar17;
              pXVar17 = pXVar17 + 1;
            } while (XVar1 == XVar2);
          }
          if (pXVar9 == L"anyAttribute") {
LAB_0033ab2a:
            if (pSVar11 != (SchemaAttDef *)0x0) {
              reportSchemaError(this,attElem,L"http://apache.org/xml/messages/XMLErrors",0x98);
            }
            pSVar11 = traverseAnyAttribute(this,attElem);
            pSVar14 = pSVar11;
            if (local_90 != (SchemaAttDef *)0x0) {
              (*(local_90->super_XMLAttDef).super_XSerializable._vptr_XSerializable[1])();
            }
          }
          else {
            pXVar17 = L"anyAttribute";
            if (pXVar9 == (XMLCh *)0x0) {
LAB_0033aaf9:
              if (*pXVar17 == L'\0') goto LAB_0033ab2a;
            }
            else {
              pXVar17 = L"anyAttribute";
              pXVar18 = pXVar9;
              do {
                XVar1 = *pXVar18;
                if (XVar1 == L'\0') goto LAB_0033aaf9;
                pXVar18 = pXVar18 + 1;
                XVar2 = *pXVar17;
                pXVar17 = pXVar17 + 1;
              } while (XVar1 == XVar2);
            }
            reportSchemaError(this,attElem,L"http://apache.org/xml/messages/XMLErrors",0x2a,pXVar9,
                              (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          }
        }
      }
LAB_0033a9f2:
      local_90 = pSVar14;
    }
    iVar7 = typeInfo->fDerivedBy;
    if (local_58.fCurCount != 0) {
      pSVar14 = (SchemaAttDef *)0x0;
      local_6c = DefAttTypes_Min;
      bVar21 = false;
      getAt = 0;
      local_78 = (SchemaAttDef *)0x0;
      do {
        ppXVar12 = ValueVectorOf<xercesc_4_0::XercesAttGroupInfo_*>::elementAt(&local_58,getAt);
        pXVar10 = *ppXVar12;
        this_00 = &pXVar10->fAnyAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>;
        pSVar6 = local_78;
        if ((this_00 != (BaseRefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) &&
           (this_00->fCurCount != 0)) {
          if (!bVar21) {
            pSVar13 = pSVar11;
            if (pSVar11 == (SchemaAttDef *)0x0) {
              pSVar13 = BaseRefVectorOf<xercesc_4_0::SchemaAttDef>::elementAt(this_00,0);
            }
            local_6c = (pSVar13->super_XMLAttDef).fDefaultType;
            bVar21 = true;
          }
          pSVar13 = pXVar10->fCompleteWildCard;
          if (pSVar14 == (SchemaAttDef *)0x0) {
            pSVar14 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
            SchemaAttDef::SchemaAttDef(pSVar14,pSVar13);
            pSVar6 = pSVar14;
            if (local_78 != (SchemaAttDef *)0x0) {
              (*(local_78->super_XMLAttDef).super_XSerializable._vptr_XSerializable[1])();
            }
          }
          else {
            attWildCardIntersection(this,pSVar14,pSVar13);
          }
        }
        local_78 = pSVar6;
        getAt = getAt + 1;
      } while (XVar5 != getAt);
      if (pSVar14 != (SchemaAttDef *)0x0) {
        if (pSVar11 == (SchemaAttDef *)0x0) {
          if (local_90 != (SchemaAttDef *)0x0) {
            (*(local_90->super_XMLAttDef).super_XSerializable._vptr_XSerializable[1])();
          }
          local_78 = (SchemaAttDef *)0x0;
          local_90 = pSVar14;
        }
        else {
          attWildCardIntersection(this,pSVar11,pSVar14);
          pSVar14 = pSVar11;
        }
        (pSVar14->super_XMLAttDef).fDefaultType = local_6c;
        pSVar11 = pSVar14;
      }
      if (local_78 != (SchemaAttDef *)0x0) {
        (*(local_78->super_XMLAttDef).super_XSerializable._vptr_XSerializable[1])(local_78);
      }
    }
    if (baseTypeInfo == (ComplexTypeInfo *)0x0) {
      pSVar14 = (SchemaAttDef *)0x0;
    }
    else {
      pSVar14 = baseTypeInfo->fAttWildCard;
    }
    if (iVar7 == 2) {
      if (isBaseAnyType) {
        pSVar14 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
        SchemaAttDef::SchemaAttDef
                  (pSVar14,L"",L"",this->fEmptyNamespaceURI,Any_Any,ProcessContents_Lax,
                   this->fGrammarPoolMemoryManager);
        local_88 = pSVar14;
      }
      else {
        local_88 = (SchemaAttDef *)0x0;
      }
      if ((pSVar14 != (SchemaAttDef *)0x0) && (pSVar11 != (SchemaAttDef *)0x0)) {
        DVar3 = (pSVar11->super_XMLAttDef).fDefaultType;
        attWildCardUnion(this,pSVar11,pSVar14);
        (pSVar11->super_XMLAttDef).fDefaultType = DVar3;
      }
    }
    else {
      local_88 = (SchemaAttDef *)0x0;
    }
    if (pSVar11 == (SchemaAttDef *)0x0) {
      if ((iVar7 == 2) && (pSVar14 != (SchemaAttDef *)0x0)) {
        if (isBaseAnyType) {
          if (typeInfo->fAttWildCard != (SchemaAttDef *)0x0) {
            (*(typeInfo->fAttWildCard->super_XMLAttDef).super_XSerializable._vptr_XSerializable[1])
                      ();
          }
          typeInfo->fAttWildCard = pSVar14;
          local_88 = (SchemaAttDef *)0x0;
        }
        else {
          pSVar11 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
          SchemaAttDef::SchemaAttDef(pSVar11,pSVar14);
          if (typeInfo->fAttWildCard != (SchemaAttDef *)0x0) {
            (*(typeInfo->fAttWildCard->super_XMLAttDef).super_XSerializable._vptr_XSerializable[1])
                      ();
          }
          typeInfo->fAttWildCard = pSVar11;
        }
      }
    }
    else {
      if (typeInfo->fAttWildCard != (SchemaAttDef *)0x0) {
        (*(typeInfo->fAttWildCard->super_XMLAttDef).super_XSerializable._vptr_XSerializable[1])();
      }
      typeInfo->fAttWildCard = pSVar11;
      if ((pSVar11->super_XMLAttDef).fType == AttTypes_Unknown) {
        local_90 = (SchemaAttDef *)0x0;
        reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x6c);
      }
      else {
        local_90 = (SchemaAttDef *)0x0;
      }
    }
    if (baseTypeInfo == (ComplexTypeInfo *)0x0) {
      bVar21 = false;
    }
    else {
      bVar21 = baseTypeInfo->fAttDefs->fCount != 0;
    }
    if (typeInfo->fAttDefs->fCount == 0) {
      bVar22 = typeInfo->fAttWildCard == (SchemaAttDef *)0x0;
    }
    else {
      bVar22 = false;
    }
    if ((iVar7 == 4) && (!bVar22)) {
      if (pSVar14 == (SchemaAttDef *)0x0 && !bVar21) {
        reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x6d);
      }
      else {
        checkAttDerivationOK(this,elem,baseTypeInfo,typeInfo);
      }
    }
    if ((baseTypeInfo != (ComplexTypeInfo *)0x0) && (baseTypeInfo->fAttDefs->fCount != 0)) {
      pXVar15 = ComplexTypeInfo::getAttDefList(baseTypeInfo);
      for (uVar20 = 0; iVar8 = (*(pXVar15->super_XSerializable)._vptr_XSerializable[10])(pXVar15),
          uVar20 < CONCAT44(extraout_var_01,iVar8); uVar20 = uVar20 + 1) {
        iVar8 = (*(pXVar15->super_XSerializable)._vptr_XSerializable[0xb])(pXVar15,uVar20);
        pSVar11 = (SchemaAttDef *)CONCAT44(extraout_var_02,iVar8);
        pQVar4 = pSVar11->fAttName;
        pXVar9 = pQVar4->fLocalPart;
        pSVar14 = RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>::get
                            (typeInfo->fAttDefs,pXVar9,pQVar4->fURIId);
        if (pSVar14 == (SchemaAttDef *)0x0) {
          if ((pSVar11->super_XMLAttDef).fDefaultType != DefAttTypes_Max) {
            pSVar14 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
            SchemaAttDef::SchemaAttDef
                      (pSVar14,pQVar4->fPrefix,pQVar4->fLocalPart,pQVar4->fURIId,
                       (pSVar11->super_XMLAttDef).fValue,(pSVar11->super_XMLAttDef).fType,
                       (pSVar11->super_XMLAttDef).fDefaultType,
                       (pSVar11->super_XMLAttDef).fEnumeration,this->fGrammarPoolMemoryManager);
            pSVar14->fDatatypeValidator = pSVar11->fDatatypeValidator;
            ComplexTypeInfo::addAttDef(typeInfo,pSVar14);
            if (pSVar11->fBaseAttDecl != (SchemaAttDef *)0x0) {
              pSVar11 = pSVar11->fBaseAttDecl;
            }
            pSVar14->fBaseAttDecl = pSVar11;
          }
        }
        else if (iVar7 == 2) {
          reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x6b,pXVar9,
                            (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
    }
    if (local_88 != (SchemaAttDef *)0x0) {
      (*(local_88->super_XMLAttDef).super_XSerializable._vptr_XSerializable[1])();
    }
    (*(local_58.fMemoryManager)->_vptr_MemoryManager[4])(local_58.fMemoryManager,local_58.fElemList)
    ;
    if (local_90 != (SchemaAttDef *)0x0) {
      (*(local_90->super_XMLAttDef).super_XSerializable._vptr_XSerializable[1])();
    }
  }
  return;
}

Assistant:

void TraverseSchema::processAttributes(const DOMElement* const elem,
                                       const DOMElement* const attElem,
                                       ComplexTypeInfo* const typeInfo,
                                       const bool isBaseAnyType) {

    // If we do not have a complexTypeInfo, then what is the point of
    // processing.
    if (typeInfo == 0) {
        return;
    }

    ComplexTypeInfo* baseTypeInfo = typeInfo->getBaseComplexTypeInfo();
    if (baseTypeInfo && baseTypeInfo->getPreprocessed())
        throw TraverseSchema::RecursingElement;

    const DOMElement* child = attElem;
    SchemaAttDef* attWildCard = 0;
    Janitor<SchemaAttDef> janAttWildCard(0);
    XercesAttGroupInfo* attGroupInfo = 0;
    ValueVectorOf<XercesAttGroupInfo*> attGroupList(4, fGrammarPoolMemoryManager);

    for (; child != 0; child = XUtil::getNextSiblingElement(child)) {

        const XMLCh* childName = child->getLocalName();

        if (XMLString::equals(childName, SchemaSymbols::fgELT_ATTRIBUTE)) {
            if(attWildCard)
                reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::AnyAttributeBeforeAttribute);

            traverseAttributeDecl(child, typeInfo);
        }
        else if (XMLString::equals(childName, SchemaSymbols::fgELT_ATTRIBUTEGROUP)) {
            if(attWildCard)
                reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::AnyAttributeBeforeAttribute);

            attGroupInfo = traverseAttributeGroupDecl(child, typeInfo);
            if (attGroupInfo && !attGroupList.containsElement(attGroupInfo)) {
                attGroupList.addElement(attGroupInfo);
            }
        }
        else if (XMLString::equals(childName, SchemaSymbols::fgELT_ANYATTRIBUTE) ) {
            if(attWildCard)
                reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateAnyAttribute);

            attWildCard = traverseAnyAttribute(child);
            janAttWildCard.reset(attWildCard);
        }
        else {
            reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::InvalidChildInComplexType, childName);
        }
    }

    // -------------------------------------------------------------
    // Handle wild card/any attribute
    // -------------------------------------------------------------
    int derivedBy = typeInfo->getDerivedBy();
    XMLSize_t attGroupListSize = attGroupList.size();

    if (attGroupListSize) {

        SchemaAttDef* completeWildCard = 0;
        Janitor<SchemaAttDef> janCompleteWildCard(0);
        XMLAttDef::DefAttTypes defAttType = XMLAttDef::Default;
        bool defAttTypeSet = false;

        for (XMLSize_t i=0; i < attGroupListSize; i++) {

            attGroupInfo = attGroupList.elementAt(i);
            XMLSize_t anyAttCount = attGroupInfo->anyAttributeCount();

            if (anyAttCount) {

                if (!defAttTypeSet) {

                    defAttType = (attWildCard) ? attWildCard->getDefaultType()
                                               : attGroupInfo->anyAttributeAt(0)->getDefaultType();
                    defAttTypeSet = true;
                }

                SchemaAttDef* attGroupWildCard = attGroupInfo->getCompleteWildCard();
                if (completeWildCard) {
                    attWildCardIntersection(completeWildCard, attGroupWildCard);
                }
                else {
                    completeWildCard = new (fGrammarPoolMemoryManager) SchemaAttDef(attGroupWildCard);
                    janCompleteWildCard.reset(completeWildCard);
                }
            }

        }

        if (completeWildCard) {

            if (attWildCard) {
                attWildCardIntersection(attWildCard, completeWildCard);
            }
            else {

                attWildCard = completeWildCard;
                janCompleteWildCard.orphan();
                janAttWildCard.reset(attWildCard);
            }

            attWildCard->setDefaultType(defAttType);
        }
    }

    SchemaAttDef* baseAttWildCard = (baseTypeInfo) ? baseTypeInfo->getAttWildCard() : 0;
    Janitor<SchemaAttDef> janBaseAttWildCard(0);

    if (derivedBy == SchemaSymbols::XSD_EXTENSION) {

        if (isBaseAnyType) {

            baseAttWildCard = new (fGrammarPoolMemoryManager) SchemaAttDef(XMLUni::fgZeroLenString,
                                               XMLUni::fgZeroLenString,
                                               fEmptyNamespaceURI, XMLAttDef::Any_Any,
                                               XMLAttDef::ProcessContents_Lax,
                                               fGrammarPoolMemoryManager);
            janBaseAttWildCard.reset(baseAttWildCard);
        }

        if (baseAttWildCard && attWildCard) {

            XMLAttDef::DefAttTypes saveDefType = attWildCard->getDefaultType();
            attWildCardUnion(attWildCard, baseAttWildCard);
            attWildCard->setDefaultType(saveDefType);
        }
    }

    // -------------------------------------------------------------
    // insert wildcard attribute
    // -------------------------------------------------------------
    if (attWildCard) {

        typeInfo->setAttWildCard(attWildCard);
        janAttWildCard.orphan();

        if (attWildCard->getType() == XMLAttDef::AttTypes_Unknown) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NotExpressibleWildCardIntersection);
        }
    }
    else if (baseAttWildCard && derivedBy == SchemaSymbols::XSD_EXTENSION) {

        if (isBaseAnyType) {

            typeInfo->setAttWildCard(baseAttWildCard);
            janBaseAttWildCard.orphan();
        }
        else {

            SchemaAttDef* newWildCard = new (fGrammarPoolMemoryManager) SchemaAttDef(baseAttWildCard);
            typeInfo->setAttWildCard(newWildCard);
        }
    }

    // -------------------------------------------------------------
    // Check attributes derivation OK
    // -------------------------------------------------------------
    bool baseWithAttributes = (baseTypeInfo && baseTypeInfo->hasAttDefs());
    bool childWithAttributes = (typeInfo->hasAttDefs() || typeInfo->getAttWildCard());

    if (derivedBy == SchemaSymbols::XSD_RESTRICTION && childWithAttributes) {

        if (!baseWithAttributes && !baseAttWildCard) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_1);
        }
        else {
            checkAttDerivationOK(elem, baseTypeInfo, typeInfo);
        }
    }

    // -------------------------------------------------------------
    // merge in base type's attribute decls
    // -------------------------------------------------------------
    if (baseTypeInfo && baseTypeInfo->hasAttDefs()) {

        SchemaAttDefList& baseAttList = (SchemaAttDefList&)
                                        baseTypeInfo->getAttDefList();

        for (XMLSize_t i=0; i<baseAttList.getAttDefCount(); i++) {

            SchemaAttDef& attDef = (SchemaAttDef&) baseAttList.getAttDef(i);
            QName* attName = attDef.getAttName();
            const XMLCh* localPart = attName->getLocalPart();

            // if found a duplicate, then skip the one from the base type
            if (typeInfo->getAttDef(localPart, attName->getURI()) != 0) {

                if (derivedBy == SchemaSymbols::XSD_EXTENSION) {
                    reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateAttInDerivation, localPart);
                }

                continue;
            }

            if (attDef.getDefaultType() != XMLAttDef::Prohibited) {

                SchemaAttDef* newAttDef = new (fGrammarPoolMemoryManager) SchemaAttDef(attName->getPrefix(),
                                                           attName->getLocalPart(),
                                                           attName->getURI(),
                                                           attDef.getValue(),
                                                           attDef.getType(),
                                                           attDef.getDefaultType(),
                                                           attDef.getEnumeration(),
                                                           fGrammarPoolMemoryManager);

                newAttDef->setDatatypeValidator(attDef.getDatatypeValidator());
                typeInfo->addAttDef(newAttDef);

                if (attDef.getBaseAttDecl())
                    newAttDef->setBaseAttDecl(attDef.getBaseAttDecl());
                else
                    newAttDef->setBaseAttDecl(&attDef);
            }
        }
    }
}